

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
bas::Vector<float2,4ul,bas::RawAllocator>::Vector<4ul>
          (Vector<float2,4ul,bas::RawAllocator> *this,Vector<float2,_4UL,_bas::RawAllocator> *other)

{
  AlignedBuffer<32UL,_4UL> *pAVar1;
  void *pvVar2;
  float2 *pfVar3;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  size_t capacity;
  
  sVar4 = Vector<float2,_4UL,_bas::RawAllocator>::size(other);
  pAVar1 = &other->m_small_buffer;
  if (other->m_begin == (float2 *)pAVar1) {
    if (sVar4 < 5) {
      *(Vector<float2,4ul,bas::RawAllocator> **)this = this + 0x1c;
      *(Vector<float2,4ul,bas::RawAllocator> **)(this + 8) = this + sVar4 * 8 + 0x1c;
      *(Vector<float2,4ul,bas::RawAllocator> **)(this + 0x10) = this + 0x3c;
      if (sVar4 != 0) {
        pfVar3 = other->m_begin;
        lVar6 = 0;
        do {
          *(undefined8 *)(this + 0x1c + lVar6) = *(undefined8 *)((long)&pfVar3->x + lVar6);
          lVar6 = lVar6 + 8;
        } while (sVar4 << 3 != lVar6);
      }
    }
    else {
      pvVar5 = aligned_malloc(sVar4 * 8,4);
      *(void **)this = pvVar5;
      pvVar2 = (void *)((long)pvVar5 + sVar4 * 8);
      *(void **)(this + 8) = pvVar2;
      *(void **)(this + 0x10) = pvVar2;
      pfVar3 = other->m_begin;
      lVar6 = 0;
      do {
        *(undefined8 *)((long)pvVar5 + lVar6) = *(undefined8 *)((long)&pfVar3->x + lVar6);
        lVar6 = lVar6 + 8;
      } while (sVar4 * 8 - lVar6 != 0);
    }
  }
  else {
    *(float2 **)this = other->m_begin;
    *(float2 **)(this + 8) = other->m_end;
    *(float2 **)(this + 0x10) = other->m_capacity_end;
  }
  other->m_begin = (float2 *)pAVar1;
  other->m_end = (float2 *)pAVar1;
  other->m_capacity_end = (float2 *)&other->field_0x3c;
  *(long *)(this + 0x40) = *(long *)(this + 8) - *(long *)this >> 3;
  other->m_debug_size = 0;
  return;
}

Assistant:

Vector(Vector<T, OtherN, Allocator> &&other) noexcept
        : m_allocator(other.m_allocator)
    {
        size_t size = other.size();

        if (other.is_small()) {
            if (size <= N) {
                /* Copy between inline buffers. */
                m_begin = this->small_buffer();
                m_end = m_begin + size;
                m_capacity_end = m_begin + N;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
            else {
                /* Copy from inline buffer to newly allocated buffer. */
                size_t capacity = size;
                m_begin = (T *)m_allocator.allocate(
                    sizeof(T) * capacity, std::alignment_of<T>::value);
                m_end = m_begin + size;
                m_capacity_end = m_begin + capacity;
                uninitialized_relocate_n(other.m_begin, size, m_begin);
            }
        }
        else {
            /* Steal the pointer. */
            m_begin = other.m_begin;
            m_end = other.m_end;
            m_capacity_end = other.m_capacity_end;
        }

        other.m_begin = other.small_buffer();
        other.m_end = other.m_begin;
        other.m_capacity_end = other.m_begin + OtherN;
        UPDATE_VECTOR_SIZE(this);
        UPDATE_VECTOR_SIZE(&other);
    }